

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O1

int Dau_DsdToGia2_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover
                     )

{
  char cVar1;
  char cVar2;
  int iVar3;
  uint iLit0;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  int Temp [3];
  Vec_Int_t vLeaves;
  int Fanins [12];
  int local_278 [12];
  Vec_Int_t local_248;
  word local_238 [65];
  
  cVar1 = **p;
  if (cVar1 == '!') {
    *p = *p + 1;
  }
  pcVar8 = *p;
  cVar2 = *pcVar8;
  if ((byte)(cVar2 + 0x9fU) < 0xc) {
    iLit0 = pLits[(int)cVar2 - 0x61];
  }
  else if (cVar2 == '[') {
    if (pStr[pMatches[(long)pcVar8 - (long)pStr]] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x70,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    pcVar7 = pStr + pMatches[(long)pcVar8 - (long)pStr];
    pcVar8 = pcVar8 + 1;
    *p = pcVar8;
    iLit0 = 0;
    if (pcVar8 < pcVar7) {
      iLit0 = 0;
      do {
        iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        if (pGia->pMuxes == (uint *)0x0) {
          iLit0 = Gia_ManHashXor(pGia,iLit0,iVar4);
        }
        else {
          iLit0 = Gia_ManHashXorReal(pGia,iLit0,iVar4);
        }
        pcVar8 = *p + 1;
        *p = pcVar8;
      } while (pcVar8 < pcVar7);
    }
    if (pcVar8 != pcVar7) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x79,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
  }
  else if (cVar2 == '<') {
    lVar6 = (long)pMatches[(long)pcVar8 - (long)pStr];
    iVar4 = 0;
    if (pStr[lVar6 + 1] == '{') {
      pcVar7 = pStr + lVar6 + 1;
      *p = pcVar7;
      if ((*pcVar7 != '{') || (pcVar7 = pStr + pMatches[(long)pcVar7 - (long)pStr], *pcVar7 != '}'))
      {
        __assert_fail("**p == \'{\' && *q2 == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x89,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pcVar5 = pStr + lVar6 + 2;
      *p = pcVar5;
      lVar6 = 0;
      if (pcVar5 < pcVar7) {
        lVar6 = 0;
        do {
          iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
          *(int *)((long)local_238 + lVar6 * 4) = iVar4;
          pcVar5 = *p + 1;
          *p = pcVar5;
          lVar6 = lVar6 + 1;
        } while (pcVar5 < pcVar7);
      }
      iVar4 = (int)lVar6;
      if (pcVar5 != pcVar7) {
        __assert_fail("*p == q2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x8c,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pLits = (int *)local_238;
    }
    *p = pcVar8;
    if ((*pcVar8 != '<') || (pcVar7 = pStr + pMatches[(long)pcVar8 - (long)pStr], *pcVar7 != '>')) {
      __assert_fail("**p == \'<\' && *q == \'>\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x94,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    if (iVar4 != 0) {
      for (; pcVar8 < pcVar7; pcVar8 = pcVar8 + 1) {
        if (((byte)(*pcVar8 + 0x9fU) < 0x1a) && (iVar4 <= *pcVar8 + -0x61)) {
          __assert_fail("*pOld - \'a\' < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x99,
                        "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
      }
    }
    pcVar5 = *p;
    pcVar8 = pcVar5 + 1;
    *p = pcVar8;
    if (pcVar8 < pcVar7) {
      lVar6 = 0;
      do {
        iVar4 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        *(int *)((long)local_278 + lVar6) = iVar4;
        lVar6 = lVar6 + 4;
        pcVar5 = *p;
        pcVar8 = pcVar5 + 1;
        *p = pcVar8;
      } while (pcVar8 < pcVar7);
      bVar9 = lVar6 == 0xc;
    }
    else {
      bVar9 = false;
    }
    if (!bVar9) {
      __assert_fail("pTemp == Temp + 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x9d,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    if (pcVar8 != pcVar7) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x9e,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    if (pcVar7[1] == '{') {
      *p = pcVar5 + 2;
      if ((pcVar5[2] != '{') || (pStr[pMatches[(long)(pcVar5 + 2) - (long)pStr]] != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0xa2,
                      "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      *p = pStr + pMatches[(long)(pcVar5 + 2) - (long)pStr];
    }
    if (pGia->pMuxes == (uint *)0x0) {
      iLit0 = Gia_ManHashMux(pGia,local_278[0],local_278[1],local_278[2]);
    }
    else {
      iLit0 = Gia_ManHashMuxReal(pGia,local_278[0],local_278[1],local_278[2]);
    }
  }
  else if (cVar2 == '(') {
    iVar4 = pMatches[(long)pcVar8 - (long)pStr];
    if (pStr[iVar4] != ')') {
      __assert_fail("**p == \'(\' && *q == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,99,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    pcVar8 = pcVar8 + 1;
    *p = pcVar8;
    iLit0 = 1;
    while (pcVar8 < pStr + iVar4) {
      iVar3 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
      iLit0 = Gia_ManHashAnd(pGia,iLit0,iVar3);
      pcVar8 = *p + 1;
      *p = pcVar8;
    }
    if (pcVar8 != pStr + iVar4) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x69,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
  }
  else {
    if (5 < (byte)(cVar2 + 0xbfU) && 9 < (byte)(cVar2 - 0x30U)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0xc0,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    iVar4 = Abc_TtReadHex(local_238,pcVar8);
    iVar3 = 1 << ((char)iVar4 - 2U & 0x1f);
    if (iVar4 < 3) {
      iVar3 = 1;
    }
    pcVar7 = *p;
    pcVar8 = pcVar7 + iVar3;
    *p = pcVar8;
    if ((pcVar7[iVar3] != '{') ||
       (pcVar7 = pStr + pMatches[(long)pcVar8 - (long)pStr], *pcVar7 != '}')) {
      __assert_fail("**p == \'{\' && *q == \'}\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0xb3,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    pcVar8 = pcVar8 + 1;
    *p = pcVar8;
    lVar6 = 0;
    if (pcVar8 < pcVar7) {
      lVar6 = 0;
      do {
        iVar3 = Dau_DsdToGia2_rec(pGia,pStr,p,pMatches,pLits,vCover);
        local_278[lVar6] = iVar3;
        pcVar8 = *p + 1;
        *p = pcVar8;
        lVar6 = lVar6 + 1;
      } while (pcVar8 < pcVar7);
    }
    if ((int)lVar6 != iVar4) {
      __assert_fail("i == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0xb6,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    if (pcVar8 != pcVar7) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0xb7,
                    "int Dau_DsdToGia2_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                   );
    }
    local_248.pArray = local_278;
    local_248.nCap = iVar4;
    local_248.nSize = iVar4;
    iLit0 = Kit_TruthToGia(pGia,(uint *)local_238,iVar4,vCover,&local_248,1);
    m_Non1Step = m_Non1Step + 1;
  }
  if (-1 < (int)iLit0) {
    return iLit0 ^ cVar1 == '!';
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10f,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Dau_DsdToGia2_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int Res = 1, Lit;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Lit = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Res = Gia_ManHashAnd( pGia, Res, Lit );
        }
        assert( *p == q );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int Res = 0, Lit;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Lit = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            if ( pGia->pMuxes )
                Res = Gia_ManHashXorReal( pGia, Res, Lit );
            else
                Res = Gia_ManHashXor( pGia, Res, Lit );
        }
        assert( *p == q );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia2_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
//        Res = Dau_DsdToGia2Compose_rec( pGia, Func, Fanins, nVars );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;        
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}